

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool AddLocal(CService *addr_,int nScore)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  uint16_t uVar3;
  Logger *pLVar4;
  _Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_> _Var5;
  int *in_R8;
  long in_FS_OFFSET;
  string_view str;
  pair<std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_bool> pVar6;
  string_view logging_function;
  int nScore_local;
  string local_100;
  CService addr;
  string local_58;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nScore_local = nScore;
  MaybeFlipIPv6toCJDNS(&addr,addr_);
  bVar2 = CNetAddr::IsRoutable(&addr.super_CNetAddr);
  if ((bVar2) && ((3 < nScore || (fDiscover != false)))) {
    bVar2 = ReachableNets::Contains(&g_reachable_nets,&addr.super_CNetAddr);
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_(&local_100,&addr);
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar4);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<std::__cxx11::string,int>
                  (&local_58,(tinyformat *)"AddLocal(%s,%i)\n",(char *)&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &nScore_local,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        pLVar4 = LogInstance();
        local_58._M_dataplus._M_p = (pointer)0x50;
        local_58._M_string_length = 0xcad8a1;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file._M_len = 0x50;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "AddLocal";
        logging_function._M_len = 8;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x119,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string((string *)&local_100);
      UniqueLock<GlobalMutex>::UniqueLock
                ((UniqueLock<GlobalMutex> *)&log_msg,&g_maplocalhost_mutex,"g_maplocalhost_mutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
                 0x11c,false);
      local_58._M_dataplus._M_p = (pointer)0x0;
      pVar6 = std::
              _Rb_tree<CNetAddr,std::pair<CNetAddr_const,LocalServiceInfo>,std::_Select1st<std::pair<CNetAddr_const,LocalServiceInfo>>,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
              ::_M_emplace_unique<CService&,LocalServiceInfo>
                        ((_Rb_tree<CNetAddr,std::pair<CNetAddr_const,LocalServiceInfo>,std::_Select1st<std::pair<CNetAddr_const,LocalServiceInfo>>,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
                          *)&mapLocalHost,&addr,(LocalServiceInfo *)&local_58);
      _Var5 = pVar6.first._M_node;
      if ((((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         ((int)_Var5._M_node[2]._M_color <= nScore_local)) {
        _Var5._M_node[2]._M_color = nScore_local + (uint)(byte)(pVar6.second ^ 1);
        uVar3 = CService::GetPort(&addr);
        *(uint16_t *)&_Var5._M_node[2].field_0x4 = uVar3;
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&log_msg);
      bVar2 = true;
      goto LAB_00709db2;
    }
  }
  bVar2 = false;
LAB_00709db2:
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool AddLocal(const CService& addr_, int nScore)
{
    CService addr{MaybeFlipIPv6toCJDNS(addr_)};

    if (!addr.IsRoutable())
        return false;

    if (!fDiscover && nScore < LOCAL_MANUAL)
        return false;

    if (!g_reachable_nets.Contains(addr))
        return false;

    LogPrintf("AddLocal(%s,%i)\n", addr.ToStringAddrPort(), nScore);

    {
        LOCK(g_maplocalhost_mutex);
        const auto [it, is_newly_added] = mapLocalHost.emplace(addr, LocalServiceInfo());
        LocalServiceInfo &info = it->second;
        if (is_newly_added || nScore >= info.nScore) {
            info.nScore = nScore + (is_newly_added ? 0 : 1);
            info.nPort = addr.GetPort();
        }
    }

    return true;
}